

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.cpp
# Opt level: O2

int duckdb::NumericHelper::UnsignedLength<unsigned_short>(uint16_t value)

{
  return ((((uint)(9 < value) - (uint)(value < 100)) - (uint)(value < 1000)) - (uint)(value < 10000)
         ) + 4;
}

Assistant:

int NumericHelper::UnsignedLength(uint16_t value) {
	int length = 1;
	length += value >= 10;
	length += value >= 100;
	length += value >= 1000;
	length += value >= 10000;
	return length;
}